

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

short __thiscall Character::SpellLevel(Character *this,short spell)

{
  bool bVar1;
  pointer pCVar2;
  _Self local_48;
  short *local_40;
  _List_node_base *local_38;
  _List_iterator<Character_Spell> local_30;
  _Self local_28;
  _List_iterator<Character_Spell> it;
  short spell_local;
  Character *this_local;
  
  it._M_node._6_2_ = spell;
  local_30._M_node =
       (_List_node_base *)
       std::begin<std::__cxx11::list<Character_Spell,std::allocator<Character_Spell>>>
                 (&this->spells);
  local_38 = (_List_node_base *)
             std::end<std::__cxx11::list<Character_Spell,std::allocator<Character_Spell>>>
                       (&this->spells);
  local_40 = (short *)((long)&it._M_node + 6);
  local_28._M_node =
       (_List_node_base *)
       std::find_if<std::_List_iterator<Character_Spell>,Character::SpellLevel(short)::__0>
                 (local_30,(_List_iterator<Character_Spell>)local_38,
                  (anon_class_8_1_a8a2f048_for__M_pred)local_40);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::end(&this->spells);
  bVar1 = std::operator!=(&local_28,&local_48);
  if (bVar1) {
    pCVar2 = std::_List_iterator<Character_Spell>::operator->(&local_28);
    this_local._6_2_ = (ushort)pCVar2->level;
  }
  else {
    this_local._6_2_ = 0;
  }
  return this_local._6_2_;
}

Assistant:

short Character::SpellLevel(short spell)
{
	auto it = std::find_if(UTIL_RANGE(this->spells), [&](Character_Spell cs)
												 { return cs.id == spell; });

	if (it != this->spells.end())
		return it->level;
	else
		return 0;
}